

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::InlinePass::HasNoReturnInLoop(InlinePass *this,Function *func)

{
  byte bVar1;
  bool bVar2;
  Op opcode;
  uint32_t uVar3;
  IRContext *pIVar4;
  FeatureManager *this_00;
  StructuredCFGAnalysis *this_01;
  Instruction *this_02;
  undefined1 local_68 [8];
  const_iterator terminal_ii;
  value_type *blk;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  bool return_in_loop;
  StructuredCFGAnalysis *structured_analysis;
  Function *func_local;
  InlinePass *this_local;
  
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_feature_mgr(pIVar4);
  bVar2 = FeatureManager::HasCapability(this_00,CapabilityShader);
  if (bVar2) {
    pIVar4 = Pass::context(&this->super_Pass);
    this_01 = IRContext::GetStructuredCFGAnalysis(pIVar4);
    bVar1 = 0;
    join_0x00000010_0x00000000_ = opt::Function::begin(func);
    _blk = opt::Function::end(func);
    while (bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                             ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                              &__end2.iterator_,
                              (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&blk), bVar2)
    {
      terminal_ii.node_ =
           (Instruction *)
           UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
      BasicBlock::cend((BasicBlock *)local_68);
      utils::IntrusiveList<spvtools::opt::Instruction>::
      iterator_template<const_spvtools::opt::Instruction>::operator--
                ((iterator_template<const_spvtools::opt::Instruction> *)local_68);
      this_02 = utils::IntrusiveList<spvtools::opt::Instruction>::
                iterator_template<const_spvtools::opt::Instruction>::operator->
                          ((iterator_template<const_spvtools::opt::Instruction> *)local_68);
      opcode = opt::Instruction::opcode(this_02);
      bVar2 = spvOpcodeIsReturn(opcode);
      if (bVar2) {
        uVar3 = BasicBlock::id((BasicBlock *)terminal_ii.node_);
        uVar3 = StructuredCFGAnalysis::ContainingLoop(this_01,uVar3);
        if (uVar3 != 0) {
          bVar1 = 1;
          break;
        }
      }
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
    }
    this_local._7_1_ = (bool)(bVar1 ^ 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InlinePass::HasNoReturnInLoop(Function* func) {
  // If control not structured, do not do loop/return analysis
  // TODO: Analyze returns in non-structured control flow
  if (!context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return false;
  const auto structured_analysis = context()->GetStructuredCFGAnalysis();
  // Search for returns in structured construct.
  bool return_in_loop = false;
  for (auto& blk : *func) {
    auto terminal_ii = blk.cend();
    --terminal_ii;
    if (spvOpcodeIsReturn(terminal_ii->opcode()) &&
        structured_analysis->ContainingLoop(blk.id()) != 0) {
      return_in_loop = true;
      break;
    }
  }
  return !return_in_loop;
}